

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O1

void ensure_connectedness(chunk *c,_Bool allow_vault_disconnect)

{
  int *colors;
  int *counts;
  size_t len;
  
  len = (long)c->width * (long)c->height * 4;
  colors = (int *)mem_zalloc(len);
  counts = (int *)mem_zalloc(len);
  build_colors(c,colors,counts,(_Bool *)0x0,true);
  join_regions(c,colors,counts,allow_vault_disconnect);
  mem_free(colors);
  mem_free(counts);
  return;
}

Assistant:

void ensure_connectedness(struct chunk *c, bool allow_vault_disconnect) {
	int size = c->height * c->width;
	int *colors = mem_zalloc(size * sizeof(int));
	int *counts = mem_zalloc(size * sizeof(int));

	build_colors(c, colors, counts, NULL, true);
	join_regions(c, colors, counts, allow_vault_disconnect);

	mem_free(colors);
	mem_free(counts);
}